

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_x_sq.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  double dVar4;
  double local_8;
  
  bVar2 = true;
  local_8 = 0.0;
  while (bVar2) {
    dVar4 = random_double();
    if ((dVar4 == 0.0) && (!NAN(dVar4))) break;
    dVar4 = pow(dVar4,0.3333333333333333);
    dVar4 = dVar4 * 8.0;
    local_8 = local_8 + (dVar4 * dVar4) / (dVar4 * 0.375 * dVar4);
    bVar2 = false;
  }
  lVar1 = std::cout;
  *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0xc;
  std::operator<<((ostream *)&std::cout,"I = ");
  poVar3 = std::ostream::_M_insert<double>(local_8);
  std::operator<<(poVar3,'\n');
  return 0;
}

Assistant:

int main() {
    int N = 1;
    auto sum = 0.0;

    for (int i = 0; i < N; i++) {
        auto z = random_double();
        if (z == 0.0)  // Ignore zero to avoid NaNs
            continue;

        auto x = icd(z);
        sum += x*x / pdf(x);
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << (sum / N) << '\n';
}